

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5ExprClearPoslists(Fts5ExprNode *pNode)

{
  long lVar1;
  
  if ((pNode->eType == 4) || (pNode->eType == 9)) {
    (pNode->pNear->apPhrase[0]->poslist).n = 0;
  }
  else if (0 < pNode->nChild) {
    lVar1 = 0;
    do {
      fts5ExprClearPoslists(pNode->apChild[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < pNode->nChild);
  }
  return;
}

Assistant:

static void fts5ExprClearPoslists(Fts5ExprNode *pNode){
  if( pNode->eType==FTS5_TERM || pNode->eType==FTS5_STRING ){
    pNode->pNear->apPhrase[0]->poslist.n = 0;
  }else{
    int i;
    for(i=0; i<pNode->nChild; i++){
      fts5ExprClearPoslists(pNode->apChild[i]);
    }
  }
}